

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5_unittest.cc
# Opt level: O2

void __thiscall Md5Hash_TestVectors_Test::~Md5Hash_TestVectors_Test(Md5Hash_TestVectors_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Md5Hash, TestVectors) {
  struct {
    const char *input;
    const char *digest;
  } test[] = {
    { "",
      "d41d8cd98f00b204e9800998ecf8427e" },
    { "a",
      "0cc175b9c0f1b6a831c399e269772661" },
    { "abc",
      "900150983cd24fb0d6963f7d28e17f72" },
    { "message digest",
      "f96b697d7cb7938d525a2f31aaf161d0" },
    { "abcdefghijklmnopqrstuvwxyz",
      "c3fcd3d76192e4007dfb496cca67e13b" },
  };
  MD5_CTX ctx;
  uint8_t digest[16];
  for (int k = 0; k < sizeof(test)/sizeof(test[0]); k++){
    MD5_Init(&ctx);
    MD5_Update(&ctx, test[k].input, strlen(test[k].input));
    MD5_Final(digest, &ctx);
    EXPECT_TRUE(IsEqual(test[k].input, digest, test[k].digest));
  }
}